

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O2

int al_ustr_compare(ALLEGRO_USTR *us1,ALLEGRO_USTR *us2)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int unaff_EBP;
  int pos1;
  int pos2;
  int local_38 [2];
  
  local_38[0] = 0;
  local_38[1] = 0;
  do {
    iVar2 = al_ustr_get_next(us1,local_38);
    iVar3 = al_ustr_get_next(us2,local_38 + 1);
    if (iVar2 == -1) {
      unaff_EBP = 0;
    }
    iVar1 = iVar2 - iVar3;
    if (iVar2 - iVar3 == 0) {
      iVar1 = unaff_EBP;
    }
  } while ((iVar2 != -1) && (unaff_EBP = iVar1, iVar2 == iVar3));
  return iVar1;
}

Assistant:

int al_ustr_compare(const ALLEGRO_USTR *us1, const ALLEGRO_USTR *us2)
{
   int pos1 = 0;
   int pos2 = 0;

   for (;;) {
      int32_t c1 = al_ustr_get_next(us1, &pos1);
      int32_t c2 = al_ustr_get_next(us2, &pos2);

      if (c1 != c2) {
         /* This happens to work even when one of c1 or c2 is -1. */
         return c1 - c2;
      }

      if (c1 == -1) /* == c2 */
         return 0;
   }
}